

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter_impl.h
# Opt level: O3

void __thiscall
lwlog::details::formatter::format_attribute<std::basic_string_view<char,std::char_traits<char>>>
          (formatter *this,string *pattern,flag_pair *flags,
          basic_string_view<char,_std::char_traits<char>_> value)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  string str_value;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,(char *)value._M_len,&local_39);
  while( true ) {
    pcVar1 = (char *)pattern->_M_string_length;
    pcVar2 = strstr((char *)this->_vptr_formatter,pcVar1);
    if (pcVar2 == (char *)0x0) break;
    uVar3 = std::__cxx11::string::find((char *)this,(ulong)pcVar1,0);
    std::__cxx11::string::replace((ulong)this,uVar3,(pattern->_M_dataplus)._M_p,(ulong)local_38[0]);
  }
  while( true ) {
    pcVar1 = *(char **)((long)&pattern->field_2 + 8);
    pcVar2 = strstr((char *)this->_vptr_formatter,pcVar1);
    if (pcVar2 == (char *)0x0) break;
    uVar3 = std::__cxx11::string::find((char *)this,(ulong)pcVar1,0);
    std::__cxx11::string::replace
              ((ulong)this,uVar3,(char *)(pattern->field_2)._M_allocated_capacity,(ulong)local_38[0]
              );
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void formatter::format_attribute(std::string& pattern, const flag_pair& flags, T value)
	{
		const std::string str_value = [&value]() {
			if constexpr (std::is_arithmetic_v<T>)					return std::to_string(value);
			else if constexpr (std::is_same_v<T, std::string>)		return value;
			else if constexpr (std::is_same_v<T, std::string_view>)	return value.data();
			else if constexpr (std::is_same_v<T, const char*>)		return value;
			else													return "";
		}();

		const auto& [verbose, shortened] = flags;
		while (std::strstr(pattern.data(), verbose.data()))
		{
			pattern.replace(pattern.find(verbose), verbose.length(), str_value);
		}

		while (std::strstr(pattern.data(), shortened.data()))
		{
			pattern.replace(pattern.find(shortened), shortened.length(), str_value);
		}
	}